

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

AffineSpace3ff * __thiscall
embree::SceneGraph::MultiTransformNode::get
          (AffineSpace3ff *__return_storage_ptr__,MultiTransformNode *this,size_t i,float time)

{
  pointer pTVar1;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar2;
  Vector *pVVar3;
  Vector *pVVar4;
  pointer pTVar5;
  ulong uVar6;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar7;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined8 uVar31;
  int iVar32;
  int iVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  
  pTVar5 = (this->spaces).
           super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = pTVar5 + i;
  uVar6 = pTVar5[i].spaces.size_active;
  if (uVar6 < 2) {
    pAVar7 = (pTVar1->spaces).items;
    uVar31 = *(undefined8 *)((long)&(pAVar7->l).vx.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vx.field_0 = *(undefined8 *)&(pAVar7->l).vx.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vx.field_0 + 8) = uVar31;
    uVar31 = *(undefined8 *)((long)&(pAVar7->l).vy.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vy.field_0 = *(undefined8 *)&(pAVar7->l).vy.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = uVar31;
    uVar31 = *(undefined8 *)((long)&(pAVar7->l).vz.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vz.field_0 = *(undefined8 *)&(pAVar7->l).vz.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = uVar31;
    fVar35 = (pAVar7->p).field_0.m128[0];
    fVar37 = (pAVar7->p).field_0.m128[1];
    fVar38 = (pAVar7->p).field_0.m128[2];
    fVar39 = (pAVar7->p).field_0.m128[3];
  }
  else {
    fVar34 = (pTVar1->time_range).lower;
    fVar34 = (time - fVar34) / ((pTVar1->time_range).upper - fVar34);
    fVar35 = floorf(fVar34);
    iVar33 = (int)uVar6;
    fVar34 = (float)(iVar33 + -1) * (fVar34 - fVar35);
    fVar35 = floorf(fVar34);
    iVar32 = 0;
    if (0 < (int)fVar35) {
      iVar32 = (int)fVar35;
    }
    iVar33 = iVar33 + -2;
    if (iVar32 < iVar33) {
      iVar33 = iVar32;
    }
    fVar34 = fVar34 - (float)iVar33;
    pAVar8 = (pTVar1->spaces).items;
    fVar36 = 1.0 - fVar34;
    pAVar2 = pAVar8 + (long)iVar33 + 1;
    fVar9 = *(float *)((long)&(pAVar2->l).vx.field_0 + 4);
    fVar10 = *(float *)((long)&(pAVar2->l).vx.field_0 + 8);
    fVar11 = *(float *)((long)&(pAVar2->l).vx.field_0 + 0xc);
    pAVar7 = pAVar8 + iVar33;
    fVar12 = *(float *)((long)&(pAVar7->l).vx.field_0 + 4);
    fVar13 = *(float *)((long)&(pAVar7->l).vx.field_0 + 8);
    fVar14 = *(float *)((long)&(pAVar7->l).vx.field_0 + 0xc);
    pVVar3 = &pAVar8[(long)iVar33 + 1].l.vy;
    fVar15 = (pVVar3->field_0).m128[0];
    fVar16 = (pVVar3->field_0).m128[1];
    fVar17 = (pVVar3->field_0).m128[2];
    fVar18 = (pVVar3->field_0).m128[3];
    pVVar3 = &pAVar8[iVar33].l.vy;
    fVar19 = (pVVar3->field_0).m128[0];
    fVar20 = (pVVar3->field_0).m128[1];
    fVar21 = (pVVar3->field_0).m128[2];
    fVar22 = (pVVar3->field_0).m128[3];
    pVVar3 = &pAVar8[(long)iVar33 + 1].l.vz;
    fVar23 = (pVVar3->field_0).m128[0];
    fVar24 = (pVVar3->field_0).m128[1];
    fVar25 = (pVVar3->field_0).m128[2];
    fVar26 = (pVVar3->field_0).m128[3];
    pVVar3 = &pAVar8[iVar33].l.vz;
    fVar27 = (pVVar3->field_0).m128[0];
    fVar28 = (pVVar3->field_0).m128[1];
    fVar29 = (pVVar3->field_0).m128[2];
    fVar30 = (pVVar3->field_0).m128[3];
    pVVar3 = &pAVar8[(long)iVar33 + 1].p;
    pVVar4 = &pAVar8[iVar33].p;
    fVar35 = fVar36 * (pVVar4->field_0).m128[0] + fVar34 * (pVVar3->field_0).m128[0];
    fVar37 = fVar36 * (pVVar4->field_0).m128[1] + fVar34 * (pVVar3->field_0).m128[1];
    fVar38 = fVar36 * (pVVar4->field_0).m128[2] + fVar34 * (pVVar3->field_0).m128[2];
    fVar39 = fVar36 * (pVVar4->field_0).m128[3] + fVar34 * (pVVar3->field_0).m128[3];
    (__return_storage_ptr__->l).vx.field_0.m128[0] =
         *(float *)&(pAVar7->l).vx.field_0 * fVar36 + *(float *)&(pAVar2->l).vx.field_0 * fVar34;
    (__return_storage_ptr__->l).vx.field_0.m128[1] = fVar12 * fVar36 + fVar9 * fVar34;
    (__return_storage_ptr__->l).vx.field_0.m128[2] = fVar13 * fVar36 + fVar10 * fVar34;
    (__return_storage_ptr__->l).vx.field_0.m128[3] = fVar14 * fVar36 + fVar11 * fVar34;
    (__return_storage_ptr__->l).vy.field_0.m128[0] = fVar19 * fVar36 + fVar15 * fVar34;
    (__return_storage_ptr__->l).vy.field_0.m128[1] = fVar20 * fVar36 + fVar16 * fVar34;
    (__return_storage_ptr__->l).vy.field_0.m128[2] = fVar21 * fVar36 + fVar17 * fVar34;
    (__return_storage_ptr__->l).vy.field_0.m128[3] = fVar22 * fVar36 + fVar18 * fVar34;
    (__return_storage_ptr__->l).vz.field_0.m128[0] = fVar27 * fVar36 + fVar23 * fVar34;
    (__return_storage_ptr__->l).vz.field_0.m128[1] = fVar28 * fVar36 + fVar24 * fVar34;
    (__return_storage_ptr__->l).vz.field_0.m128[2] = fVar29 * fVar36 + fVar25 * fVar34;
    (__return_storage_ptr__->l).vz.field_0.m128[3] = fVar30 * fVar36 + fVar26 * fVar34;
  }
  (__return_storage_ptr__->p).field_0.m128[0] = fVar35;
  (__return_storage_ptr__->p).field_0.m128[1] = fVar37;
  (__return_storage_ptr__->p).field_0.m128[2] = fVar38;
  (__return_storage_ptr__->p).field_0.m128[3] = fVar39;
  return __return_storage_ptr__;
}

Assistant:

virtual AffineSpace3ff get(size_t i, float time) const
      {
        if (spaces[i].size() <= 1) return spaces[i][0];

        int numTimeSteps = spaces[i].size();

        BBox1f time_range = spaces[i].time_range;
        time = frac((time-time_range.lower)/time_range.size());
        time = (numTimeSteps-1)*time;
        int   itime = (int)floor(time);
        itime = min(max(itime,0),(int)numTimeSteps-2);
        float ftime = time - (float)itime;

        const AffineSpace3ff xfm0 = spaces[i][itime+0];
        const AffineSpace3ff xfm1 = spaces[i][itime+1];
        const AffineSpace3ff xfm  = lerp(xfm0,xfm1,ftime);
        return xfm;
      }